

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O0

bool anon_unknown.dwarf_441bd5::ExpandMacros<cmCMakePresetsGraph::WorkflowPreset>
               (cmCMakePresetsGraph *graph,WorkflowPreset *preset,
               optional<cmCMakePresetsGraph::WorkflowPreset> *out)

{
  bool bVar1;
  int version;
  ExpandMacroResult EVar2;
  uint uVar3;
  WorkflowPreset *pWVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pmVar5;
  reference __k;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  mapped_type *pmVar6;
  element_type *peVar7;
  bool *pbVar8;
  optional<bool> local_fe;
  undefined4 local_fc;
  optional<bool> result;
  reference ppStack_f8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v_1;
  iterator __end0_1;
  iterator __begin0_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range2_1;
  unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
  local_d0;
  undefined1 local_c8 [8];
  unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
  local_c0;
  undefined1 local_b8 [8];
  unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
  local_b0;
  undefined1 auStack_a8 [8];
  MacroExpanderVector macroExpanders;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *v;
  iterator __end0;
  iterator __begin0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  envCycles;
  optional<cmCMakePresetsGraph::WorkflowPreset> *out_local;
  WorkflowPreset *preset_local;
  cmCMakePresetsGraph *graph_local;
  
  envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)out;
  std::optional<cmCMakePresetsGraph::WorkflowPreset>::
  emplace<cmCMakePresetsGraph::WorkflowPreset_const&>(out,preset);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
         *)&__range2);
  pWVar4 = std::optional<cmCMakePresetsGraph::WorkflowPreset>::operator->
                     ((optional<cmCMakePresetsGraph::WorkflowPreset> *)
                      envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pmVar5 = &(pWVar4->super_Preset).Environment;
  __end0 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin(pmVar5);
  v = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ::end(pmVar5);
  while (bVar1 = std::operator!=(&__end0,(_Self *)&v), bVar1) {
    __k = std::
          _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator*(&__end0);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                           *)&__range2,&__k->first);
    *pmVar6 = Unvisited;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end0);
  }
  auStack_a8 = (undefined1  [8])0x0;
  macroExpanders.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  macroExpanders.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
  ::vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
            *)auStack_a8);
  std::make_unique<cmCMakePresetsGraphInternal::BaseMacroExpander,cmCMakePresetsGraph&>
            ((cmCMakePresetsGraph *)local_b8);
  std::
  unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>
  ::
  unique_ptr<cmCMakePresetsGraphInternal::BaseMacroExpander,std::default_delete<cmCMakePresetsGraphInternal::BaseMacroExpander>,void>
            ((unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>
              *)&local_b0,
             (unique_ptr<cmCMakePresetsGraphInternal::BaseMacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::BaseMacroExpander>_>
              *)local_b8);
  std::
  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
  ::push_back((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
               *)auStack_a8,(value_type *)&local_b0);
  std::
  unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
  ::~unique_ptr(&local_b0);
  std::
  unique_ptr<cmCMakePresetsGraphInternal::BaseMacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::BaseMacroExpander>_>
  ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::BaseMacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::BaseMacroExpander>_>
                 *)local_b8);
  std::
  make_unique<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::WorkflowPreset>,cmCMakePresetsGraph&,cmCMakePresetsGraph::WorkflowPreset_const&>
            ((cmCMakePresetsGraph *)local_c8,(WorkflowPreset *)graph);
  std::
  unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>
  ::
  unique_ptr<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::WorkflowPreset>,std::default_delete<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::WorkflowPreset>>,void>
            ((unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>
              *)&local_c0,
             (unique_ptr<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::WorkflowPreset>,_std::default_delete<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::WorkflowPreset>_>_>
              *)local_c8);
  std::
  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
  ::push_back((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
               *)auStack_a8,(value_type *)&local_c0);
  std::
  unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
  ::~unique_ptr(&local_c0);
  std::
  unique_ptr<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::WorkflowPreset>,_std::default_delete<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::WorkflowPreset>_>_>
  ::~unique_ptr((unique_ptr<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::WorkflowPreset>,_std::default_delete<cmCMakePresetsGraphInternal::PresetMacroExpander<cmCMakePresetsGraph::WorkflowPreset>_>_>
                 *)local_c8);
  std::
  make_unique<(anonymous_namespace)::EnvironmentMacroExpander<cmCMakePresetsGraph::WorkflowPreset>,std::vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>,std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>>>&,std::optional<cmCMakePresetsGraph::WorkflowPreset>&,std::map<std::__cxx11::string,(anonymous_namespace)::CycleStatus,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,(anonymous_namespace)::CycleStatus>>>&>
            ((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
              *)&__range2_1,(optional<cmCMakePresetsGraph::WorkflowPreset> *)auStack_a8,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
              *)envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>
  ::
  unique_ptr<(anonymous_namespace)::EnvironmentMacroExpander<cmCMakePresetsGraph::WorkflowPreset>,std::default_delete<(anonymous_namespace)::EnvironmentMacroExpander<cmCMakePresetsGraph::WorkflowPreset>>,void>
            ((unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>>
              *)&local_d0,
             (unique_ptr<(anonymous_namespace)::EnvironmentMacroExpander<cmCMakePresetsGraph::WorkflowPreset>,_std::default_delete<(anonymous_namespace)::EnvironmentMacroExpander<cmCMakePresetsGraph::WorkflowPreset>_>_>
              *)&__range2_1);
  std::
  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
  ::push_back((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
               *)auStack_a8,(value_type *)&local_d0);
  std::
  unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>
  ::~unique_ptr(&local_d0);
  std::
  unique_ptr<(anonymous_namespace)::EnvironmentMacroExpander<cmCMakePresetsGraph::WorkflowPreset>,_std::default_delete<(anonymous_namespace)::EnvironmentMacroExpander<cmCMakePresetsGraph::WorkflowPreset>_>_>
  ::~unique_ptr((unique_ptr<(anonymous_namespace)::EnvironmentMacroExpander<cmCMakePresetsGraph::WorkflowPreset>,_std::default_delete<(anonymous_namespace)::EnvironmentMacroExpander<cmCMakePresetsGraph::WorkflowPreset>_>_>
                 *)&__range2_1);
  pWVar4 = std::optional<cmCMakePresetsGraph::WorkflowPreset>::operator->
                     ((optional<cmCMakePresetsGraph::WorkflowPreset> *)
                      envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count);
  pmVar5 = &(pWVar4->super_Preset).Environment;
  __end0_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin(pmVar5);
  v_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::end(pmVar5);
  while (bVar1 = std::operator!=(&__end0_1,(_Self *)&v_1), bVar1) {
    ppStack_f8 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end0_1);
    bVar1 = std::optional::operator_cast_to_bool((optional *)&ppStack_f8->second);
    if (bVar1) {
      value = std::
              optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator*(&ppStack_f8->second);
      pmVar6 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
                             *)&__range2,&ppStack_f8->first);
      version = cmCMakePresetsGraph::GetVersion(graph,&preset->super_Preset);
      EVar2 = VisitEnv(value,pmVar6,(MacroExpanderVector *)auStack_a8,version);
      if (EVar2 != Ok) {
        if (EVar2 == Ignore) {
          std::optional<cmCMakePresetsGraph::WorkflowPreset>::reset
                    ((optional<cmCMakePresetsGraph::WorkflowPreset> *)
                     envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count);
          graph_local._7_1_ = true;
          goto LAB_0033a82f;
        }
        if (EVar2 == Error) {
          cmCMakePresetsErrors::INVALID_PRESET_NAMED
                    (&(preset->super_Preset).Name,&graph->parseState);
          graph_local._7_1_ = false;
          goto LAB_0033a82f;
        }
      }
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end0_1);
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr *)&(preset->super_Preset).ConditionEvaluator);
  if (bVar1) {
    std::optional<bool>::optional(&local_fe);
    peVar7 = std::
             __shared_ptr_access<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<cmCMakePresetsGraph::Condition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&(preset->super_Preset).ConditionEvaluator);
    uVar3 = cmCMakePresetsGraph::GetVersion(graph,&preset->super_Preset);
    uVar3 = (*peVar7->_vptr_Condition[2])(peVar7,auStack_a8,(ulong)uVar3,&local_fe);
    if ((uVar3 & 1) == 0) {
      cmCMakePresetsErrors::INVALID_PRESET_NAMED(&(preset->super_Preset).Name,&graph->parseState);
      graph_local._7_1_ = false;
      goto LAB_0033a82f;
    }
    bVar1 = std::optional::operator_cast_to_bool((optional *)&local_fe);
    if (!bVar1) {
      std::optional<cmCMakePresetsGraph::WorkflowPreset>::reset
                ((optional<cmCMakePresetsGraph::WorkflowPreset> *)
                 envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count);
      graph_local._7_1_ = true;
      goto LAB_0033a82f;
    }
    pbVar8 = std::optional<bool>::operator*(&local_fe);
    bVar1 = *pbVar8;
    pWVar4 = std::optional<cmCMakePresetsGraph::WorkflowPreset>::operator->
                       ((optional<cmCMakePresetsGraph::WorkflowPreset> *)
                        envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    (pWVar4->super_Preset).ConditionResult = (bool)(bVar1 & 1);
  }
  graph_local._7_1_ =
       ExpandMacros(graph,preset,
                    (optional<cmCMakePresetsGraph::WorkflowPreset> *)
                    envCycles._M_t._M_impl.super__Rb_tree_header._M_node_count,
                    (MacroExpanderVector *)auStack_a8);
LAB_0033a82f:
  local_fc = 1;
  std::
  vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
  ::~vector((vector<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraphInternal::MacroExpander,_std::default_delete<cmCMakePresetsGraphInternal::MacroExpander>_>_>_>
             *)auStack_a8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::CycleStatus>_>_>
          *)&__range2);
  return graph_local._7_1_;
}

Assistant:

bool ExpandMacros(cmCMakePresetsGraph& graph, const T& preset,
                  cm::optional<T>& out)
{
  out.emplace(preset);

  std::map<std::string, CycleStatus> envCycles;
  for (auto const& v : out->Environment) {
    envCycles[v.first] = CycleStatus::Unvisited;
  }

  MacroExpanderVector macroExpanders{};

  macroExpanders.push_back(cm::make_unique<BaseMacroExpander>(graph));
  macroExpanders.push_back(
    cm::make_unique<PresetMacroExpander<T>>(graph, preset));
  macroExpanders.push_back(cm::make_unique<EnvironmentMacroExpander<T>>(
    macroExpanders, out, envCycles));

  for (auto& v : out->Environment) {
    if (v.second) {
      switch (VisitEnv(*v.second, envCycles[v.first], macroExpanders,
                       graph.GetVersion(preset))) {
        case ExpandMacroResult::Error:
          cmCMakePresetsErrors::INVALID_PRESET_NAMED(preset.Name,
                                                     &graph.parseState);
          return false;
        case ExpandMacroResult::Ignore:
          out.reset();
          return true;
        case ExpandMacroResult::Ok:
          break;
      }
    }
  }

  if (preset.ConditionEvaluator) {
    cm::optional<bool> result;
    if (!preset.ConditionEvaluator->Evaluate(
          macroExpanders, graph.GetVersion(preset), result)) {
      cmCMakePresetsErrors::INVALID_PRESET_NAMED(preset.Name,
                                                 &graph.parseState);
      return false;
    }
    if (!result) {
      out.reset();
      return true;
    }
    out->ConditionResult = *result;
  }

  return ExpandMacros(graph, preset, out, macroExpanders);
}